

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWITypes.cpp
# Opt level: O3

char * GetFlagName(SWI_Flag flag)

{
  if ((int)flag < 0xbb) {
    if (flag == SWIF_Command) {
      return "Command";
    }
    if (flag == SWIF_Transmit) {
      return "Transmit";
    }
  }
  else {
    if (flag == SWIF_Idle) {
      return "Idle";
    }
    if (flag == SWIF_Sleep) {
      return "Sleep";
    }
  }
  return "<unknown>";
}

Assistant:

const char* GetFlagName( SWI_Flag flag )
{
    switch( flag )
    {
    case SWIF_Transmit:
        return "Transmit";
    case SWIF_Command:
        return "Command";
    case SWIF_Idle:
        return "Idle";
    case SWIF_Sleep:
        return "Sleep";
    };

    return "<unknown>";
}